

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndForEachCommand.cxx
# Opt level: O1

bool __thiscall
cmEndForEachCommand::InvokeInitialPass
          (cmEndForEachCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *param_1,
          cmExecutionStatus *param_2)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
             ,"");
  cmCommand::SetError(&this->super_cmCommand,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmEndForEachCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const&,
                    cmExecutionStatus &)
{
  this->SetError("An ENDFOREACH command was found outside of a proper "
                 "FOREACH ENDFOREACH structure. Or its arguments did "
                 "not match the opening FOREACH command.");
  return false;
}